

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O0

string * json_schema_to_grammar(json *schema,bool force_gbnf)

{
  byte in_DL;
  string *in_RDI;
  common_grammar_options *in_stack_00000150;
  function<void_(const_common_grammar_builder_&)> *in_stack_00000158;
  function<void_(const_common_grammar_builder_&)> local_38;
  byte local_11;
  
  local_11 = in_DL & 1;
  std::function<void(common_grammar_builder_const&)>::
  function<json_schema_to_grammar(nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,bool)::__0,void>
            (&local_38,(anon_class_8_1_6b0526df *)in_RDI);
  build_grammar_abi_cxx11_(in_stack_00000158,in_stack_00000150);
  std::function<void_(const_common_grammar_builder_&)>::~function
            ((function<void_(const_common_grammar_builder_&)> *)0x33b8b6);
  return in_RDI;
}

Assistant:

std::string json_schema_to_grammar(const json & schema, bool force_gbnf) {
#ifdef LLAMA_USE_LLGUIDANCE
    if (!force_gbnf) {
        return "%llguidance {}\nstart: %json " + schema.dump();
    }
#else
    (void)force_gbnf;
#endif // LLAMA_USE_LLGUIDANCE
    return build_grammar([&](const common_grammar_builder & callbacks) {
        auto copy = schema;
        callbacks.resolve_refs(copy);
        callbacks.add_schema("", copy);
    });
}